

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abi_test.h
# Opt level: O0

crypto_word_t
abi_test::internal::CheckImpl<void,unsigned_char*,u128_const*,unsigned_char_const*,unsigned_long>
          (Result *out,bool unwind,_func_void_uchar_ptr_u128_ptr_uchar_ptr_unsigned_long *func,
          Type args,Type args_1,Type args_2,Type_conflict args_3)

{
  crypto_word_t cVar1;
  crypto_word_t *local_70;
  crypto_word_t local_68;
  crypto_word_t argv [5];
  Type args_local_2;
  Type args_local_1;
  Type args_local;
  _func_void_uchar_ptr_u128_ptr_uchar_ptr_unsigned_long *func_local;
  bool unwind_local;
  Result *out_local;
  
  local_68 = ToWord<unsigned_char*>(args);
  argv[0] = ToWord<u128_const*>(args_1);
  argv[1] = ToWord<unsigned_char_const*>(args_2);
  argv[2] = ToWord<unsigned_long>(args_3);
  local_70 = argv + 3;
  do {
    *local_70 = 0;
    local_70 = local_70 + 1;
  } while (local_70 != argv + 4);
  cVar1 = RunTrampoline(out,(crypto_word_t)func,&local_68,4,unwind);
  return cVar1;
}

Assistant:

inline crypto_word_t CheckImpl(Result *out, bool unwind, R (*func)(Args...),
                               typename DeductionGuard<Args>::Type... args) {
  // We only support up to 8 arguments, so all arguments on aarch64 are passed
  // in registers. This is simpler and avoids the iOS discrepancy around packing
  // small arguments on the stack. (See the iOS64 reference.)
  static_assert(sizeof...(args) <= 8,
                "too many arguments for abi_test_trampoline");

  // Allocate one extra entry so MSVC does not complain about zero-size arrays.
  crypto_word_t argv[sizeof...(args) + 1] = {
      ToWord(args)...,
  };
  return RunTrampoline(out, reinterpret_cast<crypto_word_t>(func), argv,
                       sizeof...(args), unwind);
}